

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::DeviceContextVkImpl::Flush
          (DeviceContextVkImpl *this,Uint32 NumCommandLists,ICommandList **ppCommandLists)

{
  VulkanCommandBuffer *CmdBuff;
  Uint8 *Args_2;
  pointer *pppVVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  atomic<unsigned_long> *paVar2;
  ResourceBindInfo *pRVar3;
  ShaderResourceCacheVk **ppSVar4;
  byte bVar5;
  undefined4 uVar6;
  ICommandList *pSrcPtr;
  pointer ppVar7;
  FenceVkImpl *pFVar8;
  iterator iVar9;
  VkSemaphore_T *pVVar10;
  iterator iVar11;
  pointer ppVVar12;
  RenderDeviceVkImpl *pRVar13;
  pointer pRVar14;
  pointer pRVar15;
  pointer puVar16;
  pointer puVar17;
  pointer pVVar18;
  ulong uVar19;
  ShaderResourceCacheVk *pSVar20;
  ShaderResourceCacheVk *pSVar21;
  ShaderResourceCacheVk *pSVar22;
  ShaderResourceCacheVk *pSVar23;
  ShaderResourceCacheVk *pSVar24;
  ShaderResourceCacheVk *pSVar25;
  ShaderResourceCacheVk *pSVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  SoftwareQueueIndex SVar30;
  Uint32 UVar31;
  VkSemaphore_T **ppVVar32;
  char (*pacVar33) [58];
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *FenceValue;
  ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this_01;
  DeviceContextVkImpl *this_02;
  char (*in_RCX) [14];
  VkCommandBuffer_T *Args_1;
  char (*Args_1_00) [94];
  pointer pRVar34;
  char (*Args_1_01) [56];
  char (*Args_1_02) [58];
  char (*Args_1_03) [62];
  ulong uVar35;
  vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
  *pSignalFences;
  bool bVar36;
  long lVar37;
  undefined1 *puVar38;
  iterator iVar39;
  QueryManagerVk *this_03;
  char (*in_R8) [94];
  RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *Sem;
  long lVar40;
  pointer pRVar41;
  pointer ppVar42;
  ulong uVar43;
  long lVar44;
  pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_> *val_fence;
  pointer ppVar45;
  pointer this_04;
  pointer pRVar46;
  array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>,_8UL> *paVar47;
  undefined1 *puVar48;
  char (*in_stack_fffffffffffff8f8) [2];
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> vkCmdBuffs;
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  DeferredCtxs;
  VkCommandBuffer vkCmdBuff;
  Uint32 local_69c;
  VkSemaphore WaitSem;
  undefined8 *puStack_690;
  ulong local_688;
  pointer ppVStack_680;
  pointer local_678;
  ulong uStack_670;
  pointer local_668;
  ulong uStack_660;
  pointer local_658;
  VulkanCommandBuffer *local_648;
  vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
  *local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  ulong local_628;
  pointer puStack_620;
  ulong local_618;
  pointer puStack_610;
  string msg;
  undefined8 local_5e0 [4];
  undefined1 local_5c0 [128];
  undefined8 local_540 [4];
  undefined8 local_520;
  undefined1 auStack_518 [24];
  undefined1 local_500 [232];
  undefined8 auStack_418 [85];
  undefined1 local_170 [320];
  
  uVar19 = (ulong)NumCommandLists;
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == true) {
    FormatString<char[54]>
              (&msg,(char (*) [54])"Flush() should only be called for immediate contexts.");
    in_RCX = (char (*) [14])0x59e;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x59e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (this->m_ActiveQueriesCounter != 0) {
    FormatString<char[34],int,char[94]>
              (&msg,(Diligent *)"Flushing device context that has ",
               (char (*) [34])&this->m_ActiveQueriesCounter,
               (int *)
               " active queries. Vulkan requires that queries are begun and ended in the same command buffer."
               ,in_R8);
    in_RCX = (char (*) [14])0x5a2;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5a2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass.m_pObject !=
      (RenderPassVkImpl *)0x0) {
    FormatString<char[54]>
              (&msg,(char (*) [54])"Flushing device context inside an active render pass.");
    in_RCX = (char (*) [14])0x5a5;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5a5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DeferredCtxs.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DeferredCtxs.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  DeferredCtxs.
  super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::reserve
            (&vkCmdBuffs,uVar19 + 1);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ::reserve(&DeferredCtxs,uVar19 + 1);
  CmdBuff = &this->m_CommandBuffer;
  vkCmdBuff = (this->m_CommandBuffer).m_VkCmdBuffer;
  if (vkCmdBuff != (VkCommandBuffer)0x0) {
    this_03 = this->m_pQueryMgr;
    if (this_03 == (QueryManagerVk *)0x0) {
      UVar31 = (this->m_State).NumCommands;
    }
    else {
      if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.IsDeferred == true) {
        FormatString<char[26],char[14]>
                  (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"!IsDeferred()",
                   in_RCX);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5b2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
        this_03 = this->m_pQueryMgr;
      }
      UVar31 = QueryManagerVk::ResetStaleQueries
                         (this_03,(((this->
                                    super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                                    super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.
                                   m_pObject)->m_LogicalVkDevice).
                                  super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,CmdBuff);
      UVar31 = UVar31 + (this->m_State).NumCommands;
      (this->m_State).NumCommands = UVar31;
    }
    if (UVar31 != 0) {
      EndRenderScope(this);
      if ((this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DvpDebugGroupCount != 0) {
        FormatString<char[37]>(&msg,(char (*) [37])"Not all debug groups have been ended");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5bd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
      super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_DvpDebugGroupCount = 0;
      VulkanUtilities::VulkanCommandBuffer::FlushBarriers(CmdBuff);
      VulkanUtilities::VulkanCommandBuffer::EndCommandBuffer(CmdBuff);
      if (vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkCommandBuffer_T*,std::allocator<VkCommandBuffer_T*>>::
        _M_realloc_insert<VkCommandBuffer_T*const&>
                  ((vector<VkCommandBuffer_T*,std::allocator<VkCommandBuffer_T*>> *)&vkCmdBuffs,
                   (iterator)
                   vkCmdBuffs.
                   super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,&vkCmdBuff);
      }
      else {
        *vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = vkCmdBuff;
        vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             vkCmdBuffs.
             super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
    }
  }
  local_69c = NumCommandLists;
  local_648 = CmdBuff;
  if (NumCommandLists != 0) {
    Args_2 = &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_Desc.QueueId;
    uVar43 = 0;
    do {
      pSrcPtr = ppCommandLists[uVar43];
      if (pSrcPtr == (ICommandList *)0x0) {
        FormatString<char[30]>(&msg,(char (*) [30])"Command list must not be null");
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5cc);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        CheckDynamicType<Diligent::CommandListVkImpl,Diligent::ICommandList>(pSrcPtr);
      }
      bVar5 = *(byte *)&pSrcPtr[6].super_IDeviceObject.super_IObject._vptr_IObject;
      if (bVar5 != *Args_2) {
        WaitSem = (VkSemaphore)CONCAT44(WaitSem._4_4_,(uint)bVar5);
        FormatString<char[35],unsigned_int,char[27],unsigned_char,char[2]>
                  (&msg,(Diligent *)"Command list recorded for QueueId ",(char (*) [35])&WaitSem,
                   (uint *)", but executed on QueueId ",(char (*) [27])Args_2,".",
                   in_stack_fffffffffffff8f8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5cd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (DeferredCtxs.
          super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          DeferredCtxs.
          super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
        ::_M_realloc_insert<>
                  (&DeferredCtxs,
                   (iterator)
                   DeferredCtxs.
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        (DeferredCtxs.
         super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)->m_pObject = (IDeviceContext *)0x0;
        DeferredCtxs.
        super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             DeferredCtxs.
             super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      if (vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
          _M_impl.super__Vector_impl_data._M_finish ==
          vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::_M_realloc_insert<>
                  (&vkCmdBuffs,
                   (iterator)
                   vkCmdBuffs.
                   super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
      }
      else {
        *vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
         _M_impl.super__Vector_impl_data._M_finish = (VkCommandBuffer_T *)0x0;
        vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             vkCmdBuffs.
             super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      Args_1 = (VkCommandBuffer_T *)pSrcPtr[8].super_IDeviceObject.super_IObject._vptr_IObject;
      vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
      _M_impl.super__Vector_impl_data._M_finish[-1] = Args_1;
      RefCntAutoPtr<Diligent::IDeviceContext>::operator=
                (DeferredCtxs.
                 super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + -1,
                 (RefCntAutoPtr<Diligent::IDeviceContext> *)(pSrcPtr + 7));
      pSrcPtr[8].super_IDeviceObject.super_IObject._vptr_IObject = (_func_int **)0x0;
      if (vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1] == (VkCommandBuffer_T *)0x0) {
        FormatString<char[39]>(&msg,(char (*) [39])"Trying to execute empty command buffer");
        Args_1 = (VkCommandBuffer_T *)0x5d1;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5d1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (DeferredCtxs.
          super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
          ._M_impl.super__Vector_impl_data._M_finish[-1].m_pObject == (IDeviceContext *)0x0) {
        FormatString<char[26],char[31]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"DeferredCtxs.back() != nullptr",(char (*) [31])Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Flush",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0x5d2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      uVar43 = uVar43 + 1;
    } while (uVar19 != uVar43);
  }
  Args_1_00 = (char (*) [94])
              ((long)(this->m_WaitManagedSemaphores).
                     super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->m_WaitManagedSemaphores).
                     super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3);
  if ((char *)((long)(this->m_VkWaitSemaphores).
                     super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_VkWaitSemaphores).
                     super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) !=
      *Args_1_00 +
      ((long)(this->m_WaitRecycledSemaphores).
             super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_WaitRecycledSemaphores).
             super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5)) {
    FormatString<char[26],char[94]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "m_VkWaitSemaphores.size() == m_WaitManagedSemaphores.size() + m_WaitRecycledSemaphores.size()"
               ,Args_1_00);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5d5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  pRVar34 = (this->m_SignalManagedSemaphores).
            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish +
            -(long)(this->m_SignalManagedSemaphores).
                   super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  if ((pointer)((long)(this->m_VkSignalSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_VkSignalSemaphores).
                     super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                     super__Vector_impl_data._M_start) != pRVar34) {
    FormatString<char[26],char[64]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.size() == m_SignalManagedSemaphores.size()",
               (char (*) [64])pRVar34);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x5d6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  ppVar45 = (this->m_SignalFences).
            super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar7 = (this->m_SignalFences).
           super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar45 == ppVar7) {
    bVar36 = false;
  }
  else {
    bVar36 = false;
    do {
      pFVar8 = (ppVar45->second).m_pObject;
      if ((pFVar8->m_TimelineSemaphore).m_VkObject != (VkSemaphore_T *)0x0) {
        FenceBase<Diligent::EngineVkImplTraits>::DvpSignal
                  (&pFVar8->super_FenceBase<Diligent::EngineVkImplTraits>,ppVar45->first);
        msg._M_dataplus._M_p = (pointer)(pFVar8->m_TimelineSemaphore).m_VkObject;
        iVar39._M_current =
             (this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar39._M_current ==
            (this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
          _M_realloc_insert<VkSemaphore_T*>
                    ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                     &this->m_VkSignalSemaphores,iVar39,(VkSemaphore_T **)&msg);
        }
        else {
          *iVar39._M_current = (VkSemaphore_T *)msg._M_dataplus._M_p;
          pppVVar1 = &(this->m_VkSignalSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar1 = *pppVVar1 + 1;
        }
        iVar9._M_current =
             (this->m_SignalSemaphoreValues).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->m_SignalSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          bVar36 = true;
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &this->m_SignalSemaphoreValues,iVar9,&ppVar45->first);
        }
        else {
          *iVar9._M_current = ppVar45->first;
          (this->m_SignalSemaphoreValues).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          bVar36 = true;
        }
      }
      ppVar45 = ppVar45 + 1;
    } while (ppVar45 != ppVar7);
  }
  ppVar45 = (this->m_WaitFences).
            super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar7 = (this->m_WaitFences).
           super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar45 != ppVar7) {
    local_640 = (vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
                 *)&this->m_WaitRecycledSemaphores;
    this_00 = &this->m_WaitSemaphoreValues;
    do {
      pFVar8 = (ppVar45->second).m_pObject;
      FenceBase<Diligent::EngineVkImplTraits>::DvpDeviceWait
                (&pFVar8->super_FenceBase<Diligent::EngineVkImplTraits>,ppVar45->first);
      pVVar10 = (pFVar8->m_TimelineSemaphore).m_VkObject;
      if (pVVar10 == (VkSemaphore_T *)0x0) {
        SVar30 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                           (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
        FenceVkImpl::ExtractSignalSemaphore
                  ((VulkanRecycledSemaphore *)&msg,pFVar8,SVar30,ppVar45->first);
        if (msg.field_2._M_allocated_capacity != 0) {
          WaitSem = (VkSemaphore)msg.field_2._M_allocated_capacity;
          iVar39._M_current =
               (this->m_VkWaitSemaphores).
               super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar39._M_current ==
              (this->m_VkWaitSemaphores).
              super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
            _M_realloc_insert<VkSemaphore_T*>
                      ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                       &this->m_VkWaitSemaphores,iVar39,&WaitSem);
          }
          else {
            *iVar39._M_current = (VkSemaphore_T *)msg.field_2._M_allocated_capacity;
            pppVVar1 = &(this->m_VkWaitSemaphores).
                        super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            *pppVVar1 = *pppVVar1 + 1;
          }
          WaitSem = (VkSemaphore)CONCAT44(WaitSem._4_4_,0x10000);
          iVar11._M_current =
               (this->m_WaitDstStageMasks).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar11._M_current ==
              (this->m_WaitDstStageMasks).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>(&this->m_WaitDstStageMasks,iVar11,(uint *)&WaitSem);
          }
          else {
            *iVar11._M_current = 0x10000;
            (this->m_WaitDstStageMasks).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar11._M_current + 1;
          }
          std::
          vector<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>>
          ::
          emplace_back<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>>
                    (local_640,(RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)&msg);
          WaitSem = (VkSemaphore)0x0;
          iVar9._M_current =
               (this->m_WaitSemaphoreValues).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar9._M_current ==
              (this->m_WaitSemaphoreValues).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>(this_00,iVar9,(unsigned_long *)&WaitSem);
          }
          else {
            *iVar9._M_current = 0;
            (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar9._M_current + 1;
          }
        }
        VulkanUtilities::VulkanSyncObjectManager::
        RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject
                  ((RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *)&msg);
      }
      else {
        ppVVar32 = (this->m_VkWaitSemaphores).
                   super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        iVar39._M_current =
             (this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
        WaitSem = pVVar10;
        if (iVar39._M_current != ppVVar32) {
          lVar40 = 0;
          uVar43 = 0;
          do {
            if (ppVVar32[uVar43] == WaitSem) {
              FormatString<char[8],char_const*,char[15],unsigned_long,char[50],unsigned_long,char[2]>
                        (&msg,(Diligent *)0x8290b5,
                         (char (*) [8])
                         &(pFVar8->super_FenceBase<Diligent::EngineVkImplTraits>).
                          super_DeviceObjectBase<Diligent::IFenceVk,_Diligent::RenderDeviceVkImpl,_Diligent::FenceDesc>
                          .m_Desc,(char **)"\' with value (",(char (*) [15])ppVar45,
                         (unsigned_long *)") is already added to wait operation with value (",
                         (char (*) [50])
                         ((long)(this_00->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start + lVar40),
                         (unsigned_long *)0x920060,in_stack_fffffffffffff8f8);
              if (DebugMessageCallback != (undefined *)0x0) {
                (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)msg._M_dataplus._M_p != &msg.field_2) {
                operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
              }
              ppVVar32 = (this->m_VkWaitSemaphores).
                         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              iVar39._M_current =
                   (this->m_VkWaitSemaphores).
                   super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
            }
            uVar43 = uVar43 + 1;
            lVar40 = lVar40 + 8;
          } while (uVar43 < (ulong)((long)iVar39._M_current - (long)ppVVar32 >> 3));
        }
        if (iVar39._M_current ==
            (this->m_VkWaitSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>>::
          _M_realloc_insert<VkSemaphore_T*const&>
                    ((vector<VkSemaphore_T*,std::allocator<VkSemaphore_T*>> *)
                     &this->m_VkWaitSemaphores,iVar39,&WaitSem);
        }
        else {
          *iVar39._M_current = WaitSem;
          pppVVar1 = &(this->m_VkWaitSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          *pppVVar1 = *pppVVar1 + 1;
        }
        msg._M_dataplus._M_p._0_4_ = 0x10000;
        iVar11._M_current =
             (this->m_WaitDstStageMasks).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar11._M_current ==
            (this->m_WaitDstStageMasks).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    (&this->m_WaitDstStageMasks,iVar11,(uint *)&msg);
        }
        else {
          *iVar11._M_current = 0x10000;
          (this->m_WaitDstStageMasks).
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar11._M_current + 1;
        }
        iVar9._M_current =
             (this->m_WaitSemaphoreValues).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar9._M_current ==
            (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_00,iVar9,
                     &ppVar45->first);
        }
        else {
          *iVar9._M_current = ppVar45->first;
          (this->m_WaitSemaphoreValues).
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar9._M_current + 1;
        }
        bVar36 = true;
      }
      ppVar45 = ppVar45 + 1;
    } while (ppVar45 != ppVar7);
  }
  pacVar33 = (char (*) [58])
             ((long)(this->m_VkWaitSemaphores).
                    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)(this->m_VkWaitSemaphores).
                   super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                   super__Vector_impl_data._M_start);
  Args_1_01 = (char (*) [56])
              ((long)(this->m_WaitDstStageMasks).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_WaitDstStageMasks).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
  if ((char (*) [56])((long)pacVar33 >> 3) != Args_1_01) {
    FormatString<char[26],char[56]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.size() == m_WaitDstStageMasks.size()",Args_1_01);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x608);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
    pacVar33 = (char (*) [58])
               ((long)(this->m_VkWaitSemaphores).
                      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
               (long)(this->m_VkWaitSemaphores).
                     super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
                     super__Vector_impl_data._M_start);
  }
  Args_1_02 = (char (*) [58])
              ((long)(this->m_WaitSemaphoreValues).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_WaitSemaphoreValues).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  if (pacVar33 != Args_1_02) {
    FormatString<char[26],char[58]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkWaitSemaphores.size() == m_WaitSemaphoreValues.size()",Args_1_02)
    ;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x609);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  Args_1_03 = (char (*) [62])
              ((long)(this->m_SignalSemaphoreValues).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)(this->m_SignalSemaphoreValues).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  if ((char (*) [62])
      ((long)(this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
      (long)(this->m_VkSignalSemaphores).
            super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
            super__Vector_impl_data._M_start) != Args_1_03) {
    FormatString<char[26],char[62]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_VkSignalSemaphores.size() == m_SignalSemaphoreValues.size()",
               Args_1_03);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x60a);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  puStack_690 = (undefined8 *)0x0;
  WaitSem = (VkSemaphore)0x4;
  uStack_670 = (ulong)((long)vkCmdBuffs.
                             super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)vkCmdBuffs.
                            super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  local_668 = vkCmdBuffs.
              super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  ppVVar12 = (this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar43 = (ulong)((long)(this->m_VkWaitSemaphores).
                         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar12) >> 3;
  local_688 = uVar43 & 0xffffffff;
  local_678 = (pointer)0x0;
  ppVStack_680 = (pointer)0x0;
  if ((int)uVar43 != 0) {
    local_678 = (this->m_WaitDstStageMasks).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start;
    ppVStack_680 = ppVVar12;
  }
  ppVVar12 = (this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar35 = (ulong)((long)(this->m_VkSignalSemaphores).
                         super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar12) >> 3;
  uStack_660 = uVar35 & 0xffffffff;
  local_658 = (pointer)0x0;
  if ((int)uVar35 != 0) {
    local_658 = ppVVar12;
  }
  local_618 = 0;
  puStack_610 = (pointer)0x0;
  local_628 = 0;
  puStack_620 = (pointer)0x0;
  local_638 = 0;
  uStack_630 = 0;
  if (bVar36) {
    puStack_610 = (pointer)0x0;
    puStack_690 = &local_638;
    local_638 = 0x3b9df29b;
    local_628 = uVar43 & 0xffffffff;
    puStack_620 = (pointer)0x0;
    if ((int)uVar43 != 0) {
      puStack_620 = (this->m_WaitSemaphoreValues).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
    local_618 = uVar35 & 0xffffffff;
    if ((int)uVar35 != 0) {
      puStack_610 = (this->m_SignalSemaphoreValues).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
    }
  }
  pRVar13 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  SVar30 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                     (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  pSignalFences = &this->m_SignalFences;
  FenceValue = (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
                *)RenderDeviceVkImpl::ExecuteCommandBuffer
                            (pRVar13,SVar30,(VkSubmitInfo *)&WaitSem,pSignalFences);
  pRVar13 = (this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
            super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject;
  SVar30 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                     (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
  this_01 = RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
            ::GetReleaseQueue(&pRVar13->
                               super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
                              ,SVar30);
  pRVar41 = (this->m_WaitRecycledSemaphores).
            super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar14 = (this->m_WaitRecycledSemaphores).
            super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pRVar41 != pRVar14) {
    do {
      VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>
      ::SetUnsignaled(pRVar41);
      ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
      DiscardResource<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,void>
                (this_01,pRVar41,(Uint64)FenceValue);
      pRVar41 = pRVar41 + 1;
    } while (pRVar41 != pRVar14);
    pRVar41 = (this->m_WaitRecycledSemaphores).
              super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar14 = (this->m_WaitRecycledSemaphores).
              super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    this_04 = pRVar41;
    if (pRVar14 != pRVar41) {
      do {
        VulkanUtilities::VulkanSyncObjectManager::
        RecycledSyncObject<VulkanUtilities::VkSemaphoreType>::~RecycledSyncObject(this_04);
        this_04 = this_04 + 1;
      } while (this_04 != pRVar14);
      (this->m_WaitRecycledSemaphores).
      super__Vector_base<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,_std::allocator<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pRVar41;
    }
  }
  pRVar34 = (this->m_WaitManagedSemaphores).
            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar15 = (this->m_WaitManagedSemaphores).
            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pRVar46 = pRVar34;
  if (pRVar15 != pRVar34) {
    do {
      RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
      ::Release(pRVar46);
      pRVar46 = pRVar46 + 8;
    } while (pRVar46 != pRVar15);
    (this->m_WaitManagedSemaphores).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar34;
  }
  puVar16 = (this->m_WaitDstStageMasks).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_WaitDstStageMasks).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish != puVar16) {
    (this->m_WaitDstStageMasks).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar16;
  }
  pRVar34 = (this->m_SignalManagedSemaphores).
            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pRVar15 = (this->m_SignalManagedSemaphores).
            super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  pRVar46 = pRVar34;
  if (pRVar15 != pRVar34) {
    do {
      RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
      ::Release(pRVar46);
      pRVar46 = pRVar46 + 8;
    } while (pRVar46 != pRVar15);
    (this->m_SignalManagedSemaphores).
    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pRVar34;
  }
  ppVVar12 = (this->m_VkWaitSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->m_VkWaitSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar12) {
    (this->m_VkWaitSemaphores).super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVVar12;
  }
  ppVVar12 = (this->m_VkSignalSemaphores).
             super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((this->m_VkSignalSemaphores).
      super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppVVar12) {
    (this->m_VkSignalSemaphores).
    super__Vector_base<VkSemaphore_T_*,_std::allocator<VkSemaphore_T_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVVar12;
  }
  ppVar45 = (this->m_SignalFences).
            super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar7 = (this->m_SignalFences).
           super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar42 = ppVar45;
  if (ppVar7 != ppVar45) {
    do {
      RefCntAutoPtr<Diligent::FenceVkImpl>::Release(&ppVar42->second);
      ppVar42 = ppVar42 + 1;
    } while (ppVar42 != ppVar7);
    (this->m_SignalFences).
    super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar45;
  }
  ppVar45 = (this->m_WaitFences).
            super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar7 = (this->m_WaitFences).
           super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar42 = ppVar45;
  if (ppVar7 != ppVar45) {
    do {
      RefCntAutoPtr<Diligent::FenceVkImpl>::Release(&ppVar42->second);
      ppVar42 = ppVar42 + 1;
    } while (ppVar42 != ppVar7);
    (this->m_WaitFences).
    super__Vector_base<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar45;
  }
  puVar17 = (this->m_WaitSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_WaitSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar17) {
    (this->m_WaitSemaphoreValues).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar17;
  }
  puVar17 = (this->m_SignalSemaphoreValues).
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_SignalSemaphoreValues).
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar17) {
    (this->m_SignalSemaphoreValues).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar17;
  }
  if (vkCmdBuff == (VkCommandBuffer)0x0) {
    lVar40 = 0;
  }
  else {
    pSignalFences =
         (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
          *)vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
    if (*vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
         _M_impl.super__Vector_impl_data._M_start != vkCmdBuff) {
      FormatString<char[26],char[34]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"vkCmdBuffs[buff_idx] == vkCmdBuff",
                 (char (*) [34])
                 vkCmdBuffs.
                 super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                 _M_impl.super__Vector_impl_data._M_start);
      pSignalFences =
           (vector<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>,_std::allocator<std::pair<unsigned_long,_Diligent::RefCntAutoPtr<Diligent::FenceVkImpl>_>_>_>
            *)0x63f;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"Flush",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x63f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    SVar30 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                       (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
    lVar40 = 1;
    DisposeCurrentCmdBuffer(this,SVar30,(Uint64)FenceValue);
  }
  if (local_69c != 0) {
    lVar37 = -lVar40;
    lVar44 = 0;
    do {
      this_02 = RefCntAutoPtr<Diligent::IDeviceContext>::RawPtr<Diligent::DeviceContextVkImpl>
                          ((RefCntAutoPtr<Diligent::IDeviceContext> *)
                           ((long)&(DeferredCtxs.
                                    super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_pObject + lVar44))
      ;
      SVar30 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                         (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
      LOCK();
      paVar2 = &(this_02->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                m_SubmittedBuffersCmdQueueMask;
      (paVar2->super___atomic_base<unsigned_long>)._M_i =
           (paVar2->super___atomic_base<unsigned_long>)._M_i | 1L << (SVar30.m_Value & 0x3f);
      UNLOCK();
      SVar30 = DeviceContextNextGenBase<Diligent::EngineVkImplTraits>::GetCommandQueueId
                         (&this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>);
      pSignalFences = FenceValue;
      DisposeVkCmdBuffer(this_02,SVar30,
                         *(VkCommandBuffer *)
                          ((long)vkCmdBuffs.
                                 super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                          lVar44 + (ulong)(uint)((int)lVar40 << 3)),(Uint64)FenceValue);
      lVar44 = lVar44 + 8;
      lVar37 = lVar37 + -1;
    } while (uVar19 << 3 != lVar44);
    lVar40 = -lVar37;
  }
  if (lVar40 != (long)vkCmdBuffs.
                      super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)vkCmdBuffs.
                      super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) {
    FormatString<char[26],char[30]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"buff_idx == vkCmdBuffs.size()",(char (*) [30])pSignalFences);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Flush",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x64d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  (this->m_State).CommittedVBsUpToDate = false;
  (this->m_State).CommittedIBUpToDate = false;
  (this->m_State).ShadingRateIsSet = false;
  (this->m_State).NullRenderTargets = false;
  (this->m_State).NumCommands = 0;
  (this->m_State).vkPipelineBindPoint = VK_PIPELINE_BIND_POINT_MAX_ENUM;
  puVar38 = local_500;
  lVar40 = 0;
  do {
    memset((void *)((long)local_5e0 + lVar40 + -0x20),0,0xe4);
    lVar37 = 0;
    do {
      *(undefined8 *)(puVar38 + lVar37 + -0x18) = 0;
      *(undefined8 *)((long)(puVar38 + lVar37 + -0x18) + 8) = 0;
      *(undefined8 *)(puVar38 + lVar37 + -8) = 0;
      *(undefined4 *)(puVar38 + lVar37) = 0xffffffff;
      lVar37 = lVar37 + 0x20;
    } while (lVar37 != 0x100);
    *(undefined8 *)((long)auStack_418 + lVar40) = 0;
    lVar40 = lVar40 + 0x1f0;
    puVar38 = puVar38 + 0x1f0;
  } while (lVar40 != 0x5d0);
  puVar38 = local_5c0;
  paVar47 = &(this->m_BindInfo)._M_elems[0].super_CommittedShaderResources.SRBs;
  lVar40 = 0;
  do {
    pSVar20 = (ShaderResourceCacheVk *)local_5e0[lVar40 * 0x3e + -4];
    pSVar21 = (ShaderResourceCacheVk *)local_5e0[lVar40 * 0x3e + -3];
    pSVar22 = (ShaderResourceCacheVk *)local_5e0[lVar40 * 0x3e + -2];
    pSVar23 = (ShaderResourceCacheVk *)local_5e0[lVar40 * 0x3e + -1];
    pSVar24 = (ShaderResourceCacheVk *)local_5e0[lVar40 * 0x3e];
    pSVar25 = (ShaderResourceCacheVk *)local_5e0[lVar40 * 0x3e + 1];
    pSVar26 = *(ShaderResourceCacheVk **)(local_5c0 + lVar40 * 0x1f0 + -8);
    ppSVar4 = (this->m_BindInfo)._M_elems[lVar40].super_CommittedShaderResources.ResourceCaches.
              _M_elems + 6;
    *ppSVar4 = (ShaderResourceCacheVk *)local_5e0[lVar40 * 0x3e + 2];
    ppSVar4[1] = pSVar26;
    ppSVar4 = (this->m_BindInfo)._M_elems[lVar40].super_CommittedShaderResources.ResourceCaches.
              _M_elems + 4;
    *ppSVar4 = pSVar24;
    ppSVar4[1] = pSVar25;
    ppSVar4 = (this->m_BindInfo)._M_elems[lVar40].super_CommittedShaderResources.ResourceCaches.
              _M_elems + 2;
    *ppSVar4 = pSVar22;
    ppSVar4[1] = pSVar23;
    pRVar3 = (this->m_BindInfo)._M_elems + lVar40;
    (pRVar3->super_CommittedShaderResources).ResourceCaches._M_elems[0] = pSVar20;
    (pRVar3->super_CommittedShaderResources).ResourceCaches._M_elems[1] = pSVar21;
    lVar37 = 0;
    do {
      lVar44 = *(long *)(puVar38 + lVar37);
      if (*(long *)((long)&paVar47->_M_elems[0].m_pRefCounters + lVar37) != lVar44) {
        RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Release
                  ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)
                   ((long)&paVar47->_M_elems[0].m_pRefCounters + lVar37));
        *(undefined8 *)((long)&paVar47->_M_elems[0].m_pObject + lVar37) =
             *(undefined8 *)(puVar38 + lVar37 + 8);
        *(long *)((long)&paVar47->_M_elems[0].m_pRefCounters + lVar37) = lVar44;
        *(undefined8 *)(puVar38 + lVar37) = 0;
        *(undefined8 *)((long)(puVar38 + lVar37) + 8) = 0;
      }
      lVar37 = lVar37 + 0x10;
    } while (lVar37 != 0x80);
    uVar6 = *(undefined4 *)(&local_520 + lVar40 * 0x3e);
    pRVar3 = (this->m_BindInfo)._M_elems + lVar40;
    (pRVar3->super_CommittedShaderResources).ResourcesValidated = (bool)(char)uVar6;
    (pRVar3->super_CommittedShaderResources).ActiveSRBMask = (char)((uint)uVar6 >> 8);
    (pRVar3->super_CommittedShaderResources).StaleSRBMask = (char)((uint)uVar6 >> 0x10);
    (pRVar3->super_CommittedShaderResources).DynamicSRBMask = (char)((uint)uVar6 >> 0x18);
    uVar27 = local_540[lVar40 * 0x3e];
    uVar28 = local_540[lVar40 * 0x3e + 1];
    uVar29 = (&local_520)[lVar40 * 0x3e + -1];
    *(undefined8 *)
     ((this->m_BindInfo)._M_elems[lVar40].super_CommittedShaderResources.CacheRevisions._M_elems + 4
     ) = local_540[lVar40 * 0x3e + 2];
    *(undefined8 *)
     ((this->m_BindInfo)._M_elems[lVar40].super_CommittedShaderResources.CacheRevisions._M_elems + 6
     ) = uVar29;
    *(undefined8 *)
     (this->m_BindInfo)._M_elems[lVar40].super_CommittedShaderResources.CacheRevisions._M_elems =
         uVar27;
    *(undefined8 *)
     ((this->m_BindInfo)._M_elems[lVar40].super_CommittedShaderResources.CacheRevisions._M_elems + 2
     ) = uVar28;
    memcpy(&(this->m_BindInfo)._M_elems[lVar40].SetInfo,auStack_518 + lVar40 * 0x1f0,0x108);
    lVar40 = lVar40 + 1;
    puVar38 = puVar38 + 0x1f0;
    paVar47 = (array<Diligent::RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>,_8UL> *)
              ((long)(paVar47 + 3) + 0x70);
  } while (lVar40 != 3);
  puVar38 = &stack0xffffffffffffffd0;
  puVar48 = local_170;
  do {
    puVar38 = puVar38 + -0x1f0;
    lVar40 = 0;
    do {
      RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl>::Release
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingVkImpl> *)(puVar48 + lVar40));
      lVar40 = lVar40 + -0x10;
    } while (lVar40 != -0x80);
    puVar48 = puVar48 + -0x1f0;
  } while ((string *)puVar38 != &msg);
  (local_648->m_State).IndexBuffer = (VkBuffer)0x0;
  (local_648->m_State).IndexBufferOffset = 0;
  (local_648->m_State).ComputePipeline = (VkPipeline)0x0;
  (local_648->m_State).RayTracingPipeline = (VkPipeline)0x0;
  (local_648->m_State).Framebuffer = (VkFramebuffer)0x0;
  (local_648->m_State).GraphicsPipeline = (VkPipeline)0x0;
  local_648->m_VkCmdBuffer = (VkCommandBuffer)0x0;
  (local_648->m_State).RenderPass = (VkRenderPass)0x0;
  (this->m_CommandBuffer).m_State.IndexType = VK_INDEX_TYPE_MAX_ENUM;
  (this->m_CommandBuffer).m_State.FramebufferWidth = 0;
  (this->m_CommandBuffer).m_State.FramebufferHeight = 0;
  (this->m_CommandBuffer).m_State.InsidePassQueries = 0;
  (this->m_CommandBuffer).m_State.OutsidePassQueries = 0;
  (this->m_CommandBuffer).m_State.DynamicRenderingHash = 0;
  (this->m_CommandBuffer).m_Barrier.MemorySrcStages = 0;
  (this->m_CommandBuffer).m_Barrier.MemoryDstStages = 0;
  (this->m_CommandBuffer).m_Barrier.MemorySrcAccess = 0;
  (this->m_CommandBuffer).m_Barrier.MemoryDstAccess = 0;
  (this->m_CommandBuffer).m_Barrier.ImageSrcStages = 0;
  (this->m_CommandBuffer).m_Barrier.ImageDstStages = 0;
  (this->m_CommandBuffer).m_Barrier.SupportedStagesMask = 0xffffffff;
  (this->m_CommandBuffer).m_Barrier.SupportedAccessMask = 0xffffffff;
  pVVar18 = (this->m_CommandBuffer).m_ImageBarriers.
            super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->m_CommandBuffer).m_ImageBarriers.
      super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
      super__Vector_impl_data._M_finish != pVVar18) {
    (this->m_CommandBuffer).m_ImageBarriers.
    super__Vector_base<VkImageMemoryBarrier,_std::allocator<VkImageMemoryBarrier>_>._M_impl.
    super__Vector_impl_data._M_finish = pVVar18;
  }
  RefCntAutoPtr<Diligent::PipelineStateVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pPipelineState,
             (PipelineStateVkImpl *)0x0);
  RefCntAutoPtr<Diligent::RenderPassVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass,
             (RenderPassVkImpl *)0x0);
  RefCntAutoPtr<Diligent::FramebufferVkImpl>::operator=
            (&(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
              super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pBoundFramebuffer,
             (FramebufferVkImpl *)0x0);
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IDeviceContext>_>_>
  ::~vector(&DeferredCtxs);
  if (vkCmdBuffs.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(vkCmdBuffs.
                    super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)vkCmdBuffs.
                          super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)vkCmdBuffs.
                          super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::Flush(Uint32               NumCommandLists,
                                ICommandList* const* ppCommandLists)
{
    DEV_CHECK_ERR(!IsDeferred(), "Flush() should only be called for immediate contexts.");

    DEV_CHECK_ERR(m_ActiveQueriesCounter == 0,
                  "Flushing device context that has ", m_ActiveQueriesCounter,
                  " active queries. Vulkan requires that queries are begun and ended in the same command buffer.");

    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr,
                  "Flushing device context inside an active render pass.");

    // TODO: replace with small_vector
    std::vector<VkCommandBuffer>               vkCmdBuffs;
    std::vector<RefCntAutoPtr<IDeviceContext>> DeferredCtxs;
    vkCmdBuffs.reserve(size_t{NumCommandLists} + 1);
    DeferredCtxs.reserve(size_t{NumCommandLists} + 1);

    VkCommandBuffer vkCmdBuff = m_CommandBuffer.GetVkCmdBuffer();
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        if (m_pQueryMgr != nullptr)
        {
            VERIFY_EXPR(!IsDeferred());
            // Note that vkCmdResetQueryPool must be called outside of a render pass,
            // so it is better to reset all queries at once at the end of the command buffer.
            m_State.NumCommands += m_pQueryMgr->ResetStaleQueries(m_pDevice->GetLogicalDevice(), m_CommandBuffer);
        }

        if (m_State.NumCommands != 0)
        {
            EndRenderScope();

#ifdef DILIGENT_DEVELOPMENT
            DEV_CHECK_ERR(m_DvpDebugGroupCount == 0, "Not all debug groups have been ended");
            m_DvpDebugGroupCount = 0;
#endif

            m_CommandBuffer.FlushBarriers();
            m_CommandBuffer.EndCommandBuffer();

            vkCmdBuffs.push_back(vkCmdBuff);
        }
    }

    // Add command buffers from deferred contexts
    for (Uint32 i = 0; i < NumCommandLists; ++i)
    {
        CommandListVkImpl* pCmdListVk = ClassPtrCast<CommandListVkImpl>(ppCommandLists[i]);
        DEV_CHECK_ERR(pCmdListVk != nullptr, "Command list must not be null");
        DEV_CHECK_ERR(pCmdListVk->GetQueueId() == GetDesc().QueueId, "Command list recorded for QueueId ", pCmdListVk->GetQueueId(), ", but executed on QueueId ", GetDesc().QueueId, ".");
        DeferredCtxs.emplace_back();
        vkCmdBuffs.emplace_back();
        pCmdListVk->Close(DeferredCtxs.back(), vkCmdBuffs.back());
        VERIFY(vkCmdBuffs.back() != VK_NULL_HANDLE, "Trying to execute empty command buffer");
        VERIFY_EXPR(DeferredCtxs.back() != nullptr);
    }

    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitManagedSemaphores.size() + m_WaitRecycledSemaphores.size());
    VERIFY_EXPR(m_VkSignalSemaphores.size() == m_SignalManagedSemaphores.size());

    bool UsedTimelineSemaphore = false;
    for (auto& val_fence : m_SignalFences)
    {
        FenceVkImpl* pFenceVk = val_fence.second;
        if (!pFenceVk->IsTimelineSemaphore())
            continue;
        UsedTimelineSemaphore = true;
        pFenceVk->DvpSignal(val_fence.first);
        m_VkSignalSemaphores.push_back(pFenceVk->GetVkSemaphore());
        m_SignalSemaphoreValues.push_back(val_fence.first);
    }

    for (auto& val_fence : m_WaitFences)
    {
        FenceVkImpl* pFenceVk = val_fence.second;
        pFenceVk->DvpDeviceWait(val_fence.first);

        if (pFenceVk->IsTimelineSemaphore())
        {
            UsedTimelineSemaphore = true;
            VkSemaphore WaitSem   = pFenceVk->GetVkSemaphore();
#ifdef DILIGENT_DEVELOPMENT
            for (size_t i = 0; i < m_VkWaitSemaphores.size(); ++i)
            {
                if (m_VkWaitSemaphores[i] == WaitSem)
                {
                    LOG_ERROR_MESSAGE("Fence '", pFenceVk->GetDesc().Name, "' with value (", val_fence.first,
                                      ") is already added to wait operation with value (", m_WaitSemaphoreValues[i], ")");
                }
            }
#endif
            m_VkWaitSemaphores.push_back(WaitSem);
            m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
            m_WaitSemaphoreValues.push_back(val_fence.first);
        }
        else
        {
            if (VulkanUtilities::VulkanRecycledSemaphore WaitSem = pFenceVk->ExtractSignalSemaphore(GetCommandQueueId(), val_fence.first))
            {
                // Here we have unique binary semaphore that must be released/recycled using release queue
                m_VkWaitSemaphores.push_back(WaitSem);
                m_WaitDstStageMasks.push_back(VK_PIPELINE_STAGE_ALL_COMMANDS_BIT);
                m_WaitRecycledSemaphores.push_back(std::move(WaitSem));
                m_WaitSemaphoreValues.push_back(0); // Ignored for binary semaphore
            }
        }
    }

    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitDstStageMasks.size());
    VERIFY_EXPR(m_VkWaitSemaphores.size() == m_WaitSemaphoreValues.size());
    VERIFY_EXPR(m_VkSignalSemaphores.size() == m_SignalSemaphoreValues.size());

    VkSubmitInfo SubmitInfo{};
    SubmitInfo.sType                = VK_STRUCTURE_TYPE_SUBMIT_INFO;
    SubmitInfo.pNext                = nullptr;
    SubmitInfo.commandBufferCount   = static_cast<uint32_t>(vkCmdBuffs.size());
    SubmitInfo.pCommandBuffers      = vkCmdBuffs.data();
    SubmitInfo.waitSemaphoreCount   = static_cast<uint32_t>(m_VkWaitSemaphores.size());
    SubmitInfo.pWaitSemaphores      = SubmitInfo.waitSemaphoreCount != 0 ? m_VkWaitSemaphores.data() : nullptr;
    SubmitInfo.pWaitDstStageMask    = SubmitInfo.waitSemaphoreCount != 0 ? m_WaitDstStageMasks.data() : nullptr;
    SubmitInfo.signalSemaphoreCount = static_cast<uint32_t>(m_VkSignalSemaphores.size());
    SubmitInfo.pSignalSemaphores    = SubmitInfo.signalSemaphoreCount != 0 ? m_VkSignalSemaphores.data() : nullptr;

    VkTimelineSemaphoreSubmitInfo TimelineSemaphoreSubmitInfo{};
    if (UsedTimelineSemaphore)
    {
        SubmitInfo.pNext = &TimelineSemaphoreSubmitInfo;

        TimelineSemaphoreSubmitInfo.sType                     = VK_STRUCTURE_TYPE_TIMELINE_SEMAPHORE_SUBMIT_INFO;
        TimelineSemaphoreSubmitInfo.pNext                     = nullptr;
        TimelineSemaphoreSubmitInfo.waitSemaphoreValueCount   = SubmitInfo.waitSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pWaitSemaphoreValues      = SubmitInfo.waitSemaphoreCount ? m_WaitSemaphoreValues.data() : nullptr;
        TimelineSemaphoreSubmitInfo.signalSemaphoreValueCount = SubmitInfo.signalSemaphoreCount;
        TimelineSemaphoreSubmitInfo.pSignalSemaphoreValues    = SubmitInfo.signalSemaphoreCount ? m_SignalSemaphoreValues.data() : nullptr;
    }

    // Submit command buffer even if there are no commands to release stale resources.
    Uint64 SubmittedFenceValue = m_pDevice->ExecuteCommandBuffer(GetCommandQueueId(), SubmitInfo, &m_SignalFences);

    // Recycle semaphores
    {
        auto& ReleaseQueue = m_pDevice->GetReleaseQueue(GetCommandQueueId());
        for (auto& Sem : m_WaitRecycledSemaphores)
        {
            Sem.SetUnsignaled();
            ReleaseQueue.DiscardResource(std::move(Sem), SubmittedFenceValue);
        }
        m_WaitRecycledSemaphores.clear();
    }

    m_WaitManagedSemaphores.clear();
    m_WaitDstStageMasks.clear();
    m_SignalManagedSemaphores.clear();
    m_VkWaitSemaphores.clear();
    m_VkSignalSemaphores.clear();
    m_SignalFences.clear();
    m_WaitFences.clear();
    m_WaitSemaphoreValues.clear();
    m_SignalSemaphoreValues.clear();

    size_t buff_idx = 0;
    if (vkCmdBuff != VK_NULL_HANDLE)
    {
        VERIFY_EXPR(vkCmdBuffs[buff_idx] == vkCmdBuff);
        DisposeCurrentCmdBuffer(GetCommandQueueId(), SubmittedFenceValue);
        ++buff_idx;
    }

    for (Uint32 i = 0; i < NumCommandLists; ++i, ++buff_idx)
    {
        DeviceContextVkImpl* pDeferredCtxVkImpl = DeferredCtxs[i].RawPtr<DeviceContextVkImpl>();
        // Set the bit in the deferred context cmd queue mask corresponding to cmd queue of this context
        pDeferredCtxVkImpl->UpdateSubmittedBuffersCmdQueueMask(GetCommandQueueId());
        // It is OK to dispose command buffer from another thread. We are not going to
        // record any commands and only need to add the buffer to the queue
        pDeferredCtxVkImpl->DisposeVkCmdBuffer(GetCommandQueueId(), std::move(vkCmdBuffs[buff_idx]), SubmittedFenceValue);
    }
    VERIFY_EXPR(buff_idx == vkCmdBuffs.size());

    m_State    = {};
    m_BindInfo = {};
    m_CommandBuffer.Reset();
    m_pPipelineState    = nullptr;
    m_pActiveRenderPass = nullptr;
    m_pBoundFramebuffer = nullptr;
}